

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrRoomLayoutFB *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *pXVar6;
  string type_prefix;
  string walluuids_prefix;
  string walluuidcountoutput_prefix;
  string walluuidcapacityinput_prefix;
  string ceilinguuid_prefix;
  string flooruuid_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_538 [32];
  string local_518;
  undefined1 local_4f8 [32];
  string local_4d8;
  string local_4b8;
  ostringstream oss_wallUuidCapacityInput;
  ostringstream oss_wallUuids;
  uint auStack_308 [88];
  ostringstream oss_wallUuidCountOutput;
  
  PointerToHexString<XrRoomLayoutFB>((XrRoomLayoutFB *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_wallUuidCapacityInput);
  std::__cxx11::string::~string((string *)&oss_wallUuidCapacityInput);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_wallUuidCapacityInput,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_wallUuidCapacityInput);
    std::__cxx11::string::~string((string *)&oss_wallUuidCapacityInput);
  }
  else {
    _oss_wallUuidCapacityInput = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_wallUuidCapacityInput);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_wallUuidCapacityInput);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_4b8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4b8,contents);
  std::__cxx11::string::~string((string *)&local_4b8);
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&flooruuid_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&flooruuid_prefix);
  std::__cxx11::string::string((string *)(local_4f8 + 0x20),(string *)&flooruuid_prefix);
  pXVar6 = (XrGeneratedDispatchTable *)local_4f8;
  std::__cxx11::string::string((string *)pXVar6,"XrUuidEXT",(allocator *)&oss_wallUuidCapacityInput)
  ;
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar6,&value->floorUuid,(string *)(local_4f8 + 0x20),(string *)local_4f8,false
                     ,contents);
  std::__cxx11::string::~string((string *)local_4f8);
  std::__cxx11::string::~string((string *)(local_4f8 + 0x20));
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&ceilinguuid_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&ceilinguuid_prefix);
  std::__cxx11::string::string((string *)(local_538 + 0x20),(string *)&ceilinguuid_prefix);
  pXVar6 = (XrGeneratedDispatchTable *)local_538;
  std::__cxx11::string::string((string *)pXVar6,"XrUuidEXT",(allocator *)&oss_wallUuidCapacityInput)
  ;
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar6,&value->ceilingUuid,(string *)(local_538 + 0x20),(string *)local_538,
                     false,contents);
  std::__cxx11::string::~string((string *)local_538);
  std::__cxx11::string::~string((string *)(local_538 + 0x20));
  if (bVar2) {
    std::__cxx11::string::string((string *)&walluuidcapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&walluuidcapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_wallUuidCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_wallUuidCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&walluuidcapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_wallUuidCountOutput);
    std::__cxx11::string::~string((string *)&oss_wallUuidCountOutput);
    std::__cxx11::string::string((string *)&walluuidcountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&walluuidcountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_wallUuidCountOutput);
    poVar4 = std::operator<<((ostream *)&oss_wallUuidCountOutput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&walluuidcountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_wallUuids);
    std::__cxx11::string::~string((string *)&oss_wallUuids);
    std::__cxx11::string::string((string *)&walluuids_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&walluuids_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_wallUuids);
    *(uint *)((long)auStack_308 + *(long *)(_oss_wallUuids + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_wallUuids + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_wallUuids);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [11])0x2128a6,&walluuids_prefix,&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_wallUuids);
    std::__cxx11::string::~string((string *)&walluuids_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_wallUuidCountOutput);
    std::__cxx11::string::~string((string *)&walluuidcountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_wallUuidCapacityInput);
    std::__cxx11::string::~string((string *)&walluuidcapacityinput_prefix);
    std::__cxx11::string::~string((string *)&ceilinguuid_prefix);
    std::__cxx11::string::~string((string *)&flooruuid_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrRoomLayoutFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string flooruuid_prefix = prefix;
        flooruuid_prefix += "floorUuid";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->floorUuid, flooruuid_prefix, "XrUuidEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string ceilinguuid_prefix = prefix;
        ceilinguuid_prefix += "ceilingUuid";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->ceilingUuid, ceilinguuid_prefix, "XrUuidEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string walluuidcapacityinput_prefix = prefix;
        walluuidcapacityinput_prefix += "wallUuidCapacityInput";
        std::ostringstream oss_wallUuidCapacityInput;
        oss_wallUuidCapacityInput << "0x" << std::hex << (value->wallUuidCapacityInput);
        contents.emplace_back("uint32_t", walluuidcapacityinput_prefix, oss_wallUuidCapacityInput.str());
        std::string walluuidcountoutput_prefix = prefix;
        walluuidcountoutput_prefix += "wallUuidCountOutput";
        std::ostringstream oss_wallUuidCountOutput;
        oss_wallUuidCountOutput << "0x" << std::hex << (value->wallUuidCountOutput);
        contents.emplace_back("uint32_t", walluuidcountoutput_prefix, oss_wallUuidCountOutput.str());
        std::string walluuids_prefix = prefix;
        walluuids_prefix += "wallUuids";
        std::ostringstream oss_wallUuids;
        oss_wallUuids << std::hex << reinterpret_cast<const void*>(value->wallUuids);
        contents.emplace_back("XrUuidEXT*", walluuids_prefix, oss_wallUuids.str());
        return true;
    } catch(...) {
    }
    return false;
}